

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O0

void CorUnix::CPalSynchronizationManager::AcquireLocalSynchLock(CPalThread *pthrCurrent)

{
  int iVar1;
  Volatile *this;
  CPalThread *pthrCurrent_local;
  
  iVar1 = ::Volatile::operator_cast_to_int
                    ((Volatile *)&(pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount);
  if (iVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","AcquireLocalSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x26e);
    fprintf(_stderr,"Expression: 0 <= pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount\n");
  }
  this = (Volatile *)
         Volatile<int>::operator++(&(pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount);
  iVar1 = ::Volatile::operator_cast_to_int(this);
  if (iVar1 == 1) {
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csSynchProcessLock);
  }
  return;
}

Assistant:

static void AcquireLocalSynchLock(CPalThread * pthrCurrent)
        { 
            _ASSERTE(0 <= pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount);
            
            if (1 == ++pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount)
            {
                InternalEnterCriticalSection(pthrCurrent, &s_csSynchProcessLock);
            }
        }